

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution::forward_int8(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  undefined1 uVar2;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  int *piVar3;
  undefined4 uVar7;
  ulong uVar8;
  Mat *pMVar9;
  uint uVar10;
  pointer piVar11;
  char cVar12;
  int iVar13;
  long lVar14;
  char cVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  Convolution *pCVar21;
  long lVar22;
  ulong uVar23;
  ulong __n;
  int iVar24;
  float *pfVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  Mat bottom_blob_bordered;
  vector<int,_std::allocator<int>_> _space_ofs;
  allocator_type local_119;
  Convolution *local_118;
  ulong local_110;
  int local_104;
  Mat *local_100;
  ulong local_f8;
  ulong local_f0;
  undefined1 local_e8 [56];
  size_t local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [40];
  undefined8 uStack_70;
  undefined1 local_68 [16];
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  uStack_70 = local_98._32_8_;
  local_e8._16_8_ = bottom_blob->elemsize;
  iVar24 = this->kernel_w;
  iVar20 = this->kernel_h;
  iVar1 = this->dilation_w;
  iVar13 = this->dilation_h;
  local_e8._0_8_ = bottom_blob->data;
  piVar3 = bottom_blob->refcount;
  local_e8._8_4_ = SUB84(piVar3,0);
  local_e8._12_4_ = (undefined4)((ulong)piVar3 >> 0x20);
  local_e8._24_4_ = bottom_blob->elempack;
  local_e8._32_8_ = bottom_blob->allocator;
  local_a8._0_4_ = bottom_blob->dims;
  local_a8._4_4_ = bottom_blob->w;
  uStack_a0._0_4_ = bottom_blob->h;
  uStack_a0._4_4_ = bottom_blob->c;
  local_e8._40_4_ = bottom_blob->dims;
  local_e8._44_4_ = bottom_blob->w;
  local_e8._48_4_ = bottom_blob->h;
  local_e8._52_4_ = bottom_blob->c;
  local_b0 = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  local_118 = this;
  if (local_e8._16_8_ != 1) {
    uVar2 = opt->use_int8_arithmetic;
    uVar4 = opt->use_packing_layout;
    uVar5 = opt->use_shader_pack8;
    uVar6 = opt->use_bf16_storage;
    uVar7 = *(undefined4 *)&opt->field_0x24;
    local_98._36_4_ = uVar7;
    local_98[0x23] = uVar6;
    local_98[0x22] = uVar5;
    local_98[0x21] = uVar4;
    local_98[0x20] = uVar2;
    local_98._0_8_ = *(undefined8 *)opt;
    local_98._16_4_ = *(undefined4 *)&opt->workspace_allocator;
    local_98._20_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
    local_98[0x18] = opt->use_winograd_convolution;
    local_98[0x19] = opt->use_sgemm_convolution;
    local_98[0x1a] = opt->use_int8_inference;
    local_98[0x1b] = opt->use_vulkan_compute;
    local_98[0x1c] = opt->use_fp16_packed;
    local_98[0x1d] = opt->use_fp16_storage;
    local_98[0x1e] = opt->use_fp16_arithmetic;
    local_98[0x1f] = opt->use_int8_storage;
    local_98._8_4_ = SUB84(opt->workspace_allocator,0);
    local_98._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    quantize_float32_to_int8
              (bottom_blob,(Mat *)local_e8,this->bottom_blob_int8_scale,(Option *)local_98);
  }
  local_98._16_4_ = 0;
  local_98._20_4_ = 0;
  local_98._24_4_ = 0;
  local_98._0_8_ = (void *)0x0;
  local_98._8_4_ = 0;
  local_98._12_4_ = 0;
  stack0xffffffffffffff88 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  make_padding(local_118,(Mat *)local_e8,(Mat *)local_98,opt);
  pCVar21 = local_118;
  iVar17 = -100;
  if ((void *)local_98._0_8_ != (void *)0x0) {
    if ((long)(int)local_68._4_4_ * local_68._8_8_ != 0) {
      iVar17 = uStack_70._4_4_;
      uVar8 = (long)(~((iVar24 + -1) * iVar1) + uStack_70._4_4_) / (long)local_118->stride_w;
      uVar18 = (long)(~((iVar20 + -1) * iVar13) + local_68._0_4_) / (long)local_118->stride_h;
      __n = (long)local_118->kernel_h * (long)local_118->kernel_w;
      local_100 = top_blob;
      std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_119);
      piVar11 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pMVar9 = local_100;
      if (0 < pCVar21->kernel_h) {
        iVar24 = pCVar21->dilation_h;
        iVar20 = pCVar21->dilation_w;
        iVar1 = pCVar21->kernel_w;
        iVar13 = 0;
        iVar16 = 0;
        iVar19 = 0;
        do {
          if (0 < pCVar21->kernel_w) {
            lVar22 = 0;
            do {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar19 + lVar22] = iVar16;
              iVar16 = iVar16 + pCVar21->dilation_w;
              lVar22 = lVar22 + 1;
            } while ((int)lVar22 < pCVar21->kernel_w);
            iVar19 = iVar19 + (int)lVar22;
          }
          iVar16 = iVar16 + (iVar17 * iVar24 - iVar20 * iVar1);
          iVar13 = iVar13 + 1;
        } while (iVar13 < pCVar21->kernel_h);
      }
      local_f8 = uVar18 & 0xffffffff;
      local_f0 = uVar8 & 0xffffffff;
      Mat::create(local_100,(int)uVar8 + 1,(int)uVar18 + 1,pCVar21->num_output,
                  ((ulong)pCVar21->use_int8_requantize ^ 1) * 3 + 1,opt->blob_allocator);
      iVar17 = -100;
      if ((pMVar9->data != (void *)0x0) && ((long)pMVar9->c * pMVar9->cstep != 0)) {
        if (0 < local_118->num_output) {
          uVar10 = local_a8._4_4_;
          uVar8 = (ulong)local_a8._4_4_;
          local_104 = (int)__n * local_a8._4_4_;
          lVar22 = 0;
          uVar18 = local_f8;
          pCVar21 = local_118;
          do {
            if (-1 < (int)uVar18) {
              pfVar25 = (float *)(local_100->cstep * lVar22 * local_100->elemsize +
                                 (long)local_100->data);
              local_50 = (long)(local_104 * (int)lVar22);
              local_110 = 0;
              local_a8 = lVar22;
              do {
                if (-1 < (int)local_f0) {
                  iVar24 = 0;
                  do {
                    if ((int)uVar10 < 1) {
                      fVar27 = 0.0;
                    }
                    else {
                      lVar22 = (long)(pCVar21->weight_data).data + local_50;
                      uVar18 = 0;
                      iVar20 = 0;
                      do {
                        if (0 < (int)__n) {
                          uVar23 = 0;
                          do {
                            iVar20 = iVar20 + (int)*(char *)(lVar22 + uVar23) *
                                              (int)*(char *)(local_98._0_8_ +
                                                            (long)piVar11[uVar23] +
                                                            local_68._8_8_ *
                                                            CONCAT44(local_98._20_4_,local_98._16_4_
                                                                    ) * uVar18 +
                                                            (long)iVar24 * (long)pCVar21->stride_w +
                                                            (long)(uStack_70._4_4_ * (int)local_110
                                                                  * pCVar21->stride_h) *
                                                            CONCAT44(local_98._20_4_,local_98._16_4_
                                                                    ));
                            uVar23 = uVar23 + 1;
                          } while ((__n & 0xffffffff) != uVar23);
                        }
                        lVar22 = lVar22 + __n;
                        uVar18 = uVar18 + 1;
                      } while (uVar18 != uVar8);
                      fVar27 = (float)iVar20;
                      lVar22 = local_a8;
                      pCVar21 = local_118;
                    }
                    if (pCVar21->use_int8_requantize == false) {
                      fVar28 = *(float *)((long)(pCVar21->weight_data_int8_scales).data + lVar22 * 4
                                         );
                      fVar27 = (float)(~-(uint)(fVar28 == 0.0) &
                                      (uint)(1.0 / (pCVar21->bottom_blob_int8_scale * fVar28))) *
                               fVar27;
                      if (pCVar21->bias_term != 0) {
                        fVar27 = fVar27 + *(float *)((long)(pCVar21->bias_data).data + lVar22 * 4);
                      }
                      fVar28 = 0.0;
                      if (0.0 <= fVar27) {
                        fVar28 = fVar27;
                      }
                      if (pCVar21->activation_type != 1) {
                        fVar28 = fVar27;
                      }
                      *pfVar25 = fVar28;
                      lVar14 = 4;
                    }
                    else {
                      fVar28 = *(float *)((long)(pCVar21->weight_data_int8_scales).data + lVar22 * 4
                                         );
                      fVar27 = (float)(~-(uint)(fVar28 == 0.0) &
                                      (uint)(1.0 / (pCVar21->bottom_blob_int8_scale * fVar28))) *
                               fVar27;
                      if (pCVar21->bias_term != 0) {
                        fVar27 = fVar27 + *(float *)((long)(pCVar21->bias_data).data + lVar22 * 4);
                      }
                      fVar27 = roundf(fVar27 * pCVar21->top_blob_int8_scale);
                      iVar20 = (int)fVar27;
                      if (iVar20 < -0x7e) {
                        iVar20 = -0x7f;
                      }
                      if (0x7e < iVar20) {
                        iVar20 = 0x7f;
                      }
                      cVar12 = (char)iVar20;
                      cVar15 = '\0';
                      if ('\0' < cVar12) {
                        cVar15 = cVar12;
                      }
                      if (local_118->activation_type != 1) {
                        cVar15 = cVar12;
                      }
                      *(char *)pfVar25 = cVar15;
                      lVar14 = 1;
                      lVar22 = local_a8;
                      pCVar21 = local_118;
                    }
                    pfVar25 = (float *)((long)pfVar25 + lVar14);
                    bVar26 = iVar24 != (int)local_f0;
                    iVar24 = iVar24 + 1;
                  } while (bVar26);
                }
                iVar24 = (int)local_110;
                local_110 = (ulong)(iVar24 + 1);
                uVar18 = local_f8;
              } while (iVar24 != (int)local_f8);
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < pCVar21->num_output);
        }
        iVar17 = 0;
      }
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if ((Allocator *)local_98._32_8_ == (Allocator *)0x0) {
        if ((void *)local_98._0_8_ != (void *)0x0) {
          free((void *)local_98._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_98._32_8_ + 0x18))();
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_e8._12_4_,local_e8._8_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if ((Allocator *)local_e8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_e8._0_8_ != (void *)0x0) {
          free((void *)local_e8._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_e8._32_8_ + 0x18))();
      }
    }
  }
  return iVar17;
}

Assistant:

int Convolution::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Convolution input %d x %d  ksize=%d %d  stride=%d %d\n", w, h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_float32_to_int8(bottom_blob, bottom_blob_unbordered, bottom_blob_int8_scale, opt_g);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        signed char* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                int sum = 0;

                const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        int val = sptr[ space_ofs[k] ];
                        int w = kptr[k];
                        sum += val * w;
                    }

                    kptr += maxk;
                }

                if (use_int8_requantize)
                {
                    // requantize and relu
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                    float sumfp32 = sum * scale_in;

                    if (bias_term)
                        sumfp32 += bias_data[p];

                    float scale_out = top_blob_int8_scale;//FIXME load param

                    signed char sums8 = float2int8(sumfp32 * scale_out);

                    if (activation_type == 1)
                    {
                        sums8 = std::max(sums8, (signed char)0);
                    }

                    outptr[0] = sums8;
                    outptr += 1;
                }
                else
                {
                    // dequantize and relu
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                    float sumfp32 = sum * scale_in;
                    if (bias_term)
                        sumfp32 += bias_data[p];

                    if (activation_type == 1)
                    {
                        sumfp32 = std::max(sumfp32, 0.f);
                    }

                    ((float*)outptr)[0] = sumfp32;
                    outptr += 4;
                }
            }
        }
    }

    return 0;
}